

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O2

size_t __thiscall flow::ConstantPool::makeHandler(ConstantPool *this,string *name)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  __type_conflict2 _Var1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)(this->handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->handlers_;
  sVar2 = lVar5 / 0x38;
  lVar4 = 0;
  sVar3 = 0;
  while( true ) {
    if (sVar2 == sVar3) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::resize(this_00,sVar2 + 1);
      std::__cxx11::string::_M_assign
                ((string *)
                 (lVar5 + (long)(this_00->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start));
      return sVar2;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this_00->
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->first).
                                    _M_dataplus._M_p + lVar4),name);
    if (_Var1) break;
    sVar3 = sVar3 + 1;
    lVar4 = lVar4 + 0x38;
  }
  return sVar3;
}

Assistant:

size_t ConstantPool::makeHandler(const std::string& name) {
  size_t i = 0;
  size_t e = handlers_.size();

  while (i != e) {
    if (handlers_[i].first == name) {
      return i;
    }

    ++i;
  }

  handlers_.resize(i + 1);
  handlers_[i].first = name;
  return i;
}